

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O3

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
tinyusdz::anon_unknown_0::ExpandWithIndices<bool>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,vector<bool,_std::allocator<bool>_> *values,uint32_t elementSize,
          vector<int,_std::allocator<int>_> *indices,vector<bool,_std::allocator<bool>_> *dest)

{
  uint uVar1;
  pointer piVar2;
  _Bit_type *p_Var3;
  _Bit_type *p_Var4;
  undefined8 uVar5;
  anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  *in_RAX;
  anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  *extraout_RAX;
  vector<bool,_std::allocator<bool>_> *pvVar6;
  anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  *extraout_RAX_00;
  long lVar7;
  anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  *paVar8;
  long *plVar9;
  anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  *extraout_RAX_01;
  anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  *extraout_RAX_02;
  ulong uVar10;
  anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  *paVar11;
  pointer piVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  value_type_conflict vVar16;
  ulong uVar17;
  ulong uVar18;
  vector<unsigned_long,_std::allocator<unsigned_long>_> invalidIndices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  unexpected_type<const_char_*> local_a0;
  undefined8 local_98;
  anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  local_90;
  anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  *local_70;
  undefined8 local_68;
  undefined1 local_60 [32];
  long local_40;
  
  if (dest == (vector<bool,_std::allocator<bool>_> *)0x0) {
    local_a0.m_error = "`dest` is nullptr.";
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,&local_a0);
    return (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)extraout_RAX;
  }
  piVar12 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start;
  piVar2 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar12 == piVar2) {
    pvVar6 = std::vector<bool,_std::allocator<bool>_>::operator=(dest,values);
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = true;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value = true;
    return (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
               *)CONCAT71((int7)((ulong)pvVar6 >> 8),1);
  }
  if (elementSize == 0) {
LAB_001772e8:
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = true;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value = false;
    return (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)in_RAX;
  }
  uVar14 = (ulong)(values->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
           ((long)(values->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
           (long)(values->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
  uVar17 = (ulong)elementSize;
  in_RAX = (anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
            *)(uVar14 / uVar17);
  if (uVar14 % uVar17 != 0) goto LAB_001772e8;
  std::vector<bool,_std::allocator<bool>_>::resize
            (dest,((long)piVar2 - (long)piVar12 >> 2) * uVar17,false);
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_a0.m_error = (error_type)0x0;
  piVar12 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start;
  if ((indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish == piVar12) {
    vVar16 = true;
    paVar8 = extraout_RAX_00;
  }
  else {
    vVar16 = true;
    local_90._16_8_ = __return_storage_ptr__;
    local_90._24_8_ = dest;
    do {
      uVar1 = piVar12[(long)local_a0.m_error];
      if (((int)uVar1 < 0) ||
         (uVar13 = ((ulong)uVar1 + 1) * uVar17,
         p_Var3 = (values->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
         uVar14 = (ulong)(values->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                  ((long)(values->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                  (long)p_Var3) * 8, uVar14 <= uVar13 && uVar13 - uVar14 != 0)) {
        if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_b8,
                     (iterator)
                     local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_a0);
        }
        else {
          *local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = (unsigned_long)local_a0.m_error;
          local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        vVar16 = false;
      }
      else {
        p_Var4 = (dest->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
                 ._M_start.super__Bit_iterator_base._M_p;
        uVar14 = 0;
        do {
          uVar13 = uVar1 * uVar17 + uVar14;
          uVar10 = uVar14 + (long)local_a0.m_error * uVar17;
          uVar15 = uVar14 + 0x3f + (long)local_a0.m_error * uVar17;
          if (-1 < (long)uVar10) {
            uVar15 = uVar10;
          }
          lVar7 = (long)uVar15 >> 6;
          uVar18 = (ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001);
          uVar15 = 1L << ((byte)uVar10 & 0x3f);
          if ((p_Var3[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) == 0) {
            uVar15 = ~uVar15 & p_Var4[lVar7 + uVar18 + 0xffffffffffffffff];
          }
          else {
            uVar15 = uVar15 | p_Var4[lVar7 + uVar18 + 0xffffffffffffffff];
          }
          p_Var4[lVar7 + uVar18 + 0xffffffffffffffff] = uVar15;
          uVar14 = uVar14 + 1;
          dest = (vector<bool,_std::allocator<bool>_> *)local_90._24_8_;
        } while (uVar17 != uVar14);
      }
      uVar5 = local_90._16_8_;
      local_a0.m_error = local_a0.m_error + 1;
      piVar12 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      paVar8 = (anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                *)((long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar12 >> 2);
    } while (local_a0.m_error < paVar8);
    __return_storage_ptr__ =
         (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_90._16_8_;
    if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      tinyusdz::value::print_array_snipped<unsigned_long>((string *)(local_60 + 0x10),&local_b8,5);
      plVar9 = (long *)std::__cxx11::string::replace
                                 ((ulong)(local_60 + 0x10),0,(char *)0x0,0x247013);
      local_70 = (anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                  *)local_60;
      paVar8 = (anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                *)(plVar9 + 2);
      if ((anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
           *)*plVar9 == paVar8) {
        local_60._0_8_ =
             (((storage_t<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                *)&(paVar8->m_error)._M_dataplus)->
             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).field_0.m_error._M_dataplus._M_p;
        local_60._8_8_ = plVar9[3];
        paVar11 = local_70;
      }
      else {
        local_60._0_8_ =
             (((storage_t<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                *)&(paVar8->m_error)._M_dataplus)->
             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).field_0.m_error._M_dataplus._M_p;
        paVar11 = (anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                   *)*plVar9;
      }
      local_90.m_error._M_dataplus._M_p = (_Alloc_hider)local_60._0_8_;
      lVar7 = plVar9[1];
      *plVar9 = (long)paVar8;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      local_a0.m_error = (error_type)&local_90;
      if (paVar11 == local_70) {
        local_90.m_error._M_string_length = local_60._8_8_;
        paVar11 = (anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                   *)local_a0.m_error;
      }
      local_68 = 0;
      local_60._0_8_ = local_60._0_8_ & 0xffffffffffffff00;
      *(bool *)(uVar5 + 0x20) = false;
      *(_Alloc_hider **)uVar5 = (_Alloc_hider *)(uVar5 + 0x10);
      if (paVar11 ==
          (anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
           *)local_a0.m_error) {
        ((_Alloc_hider *)(uVar5 + 0x10))->_M_p = (pointer)local_90.m_error._M_dataplus._M_p;
        *(size_type *)(uVar5 + 0x18) = local_90.m_error._M_string_length;
      }
      else {
        *(anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
          **)uVar5 = paVar11;
        ((_Alloc_hider *)(uVar5 + 0x10))->_M_p = (pointer)local_90.m_error._M_dataplus._M_p;
      }
      *(long *)(uVar5 + 8) = lVar7;
      local_98 = 0;
      local_90.m_error._M_dataplus._M_p =
           (_Alloc_hider)((ulong)local_90.m_error._M_dataplus._M_p & 0xffffffffffffff00);
      paVar8 = (anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                *)(local_60 + 0x20);
      if ((anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
           *)local_60._16_8_ != paVar8) {
        operator_delete((void *)local_60._16_8_,local_40 + 1);
        paVar8 = extraout_RAX_01;
      }
      goto LAB_001775bc;
    }
  }
  (__return_storage_ptr__->contained).
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .m_has_value = true;
  (__return_storage_ptr__->contained).
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_value = vVar16;
LAB_001775bc:
  if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start == (unsigned_long *)0x0) {
    return (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)paVar8;
  }
  operator_delete(local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start,
                  (long)local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  return (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)extraout_RAX_02;
}

Assistant:

nonstd::expected<bool, std::string> ExpandWithIndices(
    const std::vector<T> &values, uint32_t elementSize, const std::vector<int32_t> &indices,
    std::vector<T> *dest) {
  if (!dest) {
    return nonstd::make_unexpected("`dest` is nullptr.");
  }

  if (indices.empty()) {
    (*dest) = values;
    return true;
  }

  if (elementSize == 0) {
    return false;
  }

  if ((values.size() % elementSize) != 0) {
    return false;
  }

  dest->resize(indices.size() * elementSize);

  std::vector<size_t> invalidIndices;

  bool valid = true;
  for (size_t i = 0; i < indices.size(); i++) {
    int32_t idx = indices[i];
    if ((idx >= 0) && ((size_t(idx+1) * size_t(elementSize)) <= values.size())) {
      for (size_t k = 0; k < elementSize; k++) {
        (*dest)[i*elementSize + k] = values[size_t(idx)*elementSize + k];
      }
    } else {
      invalidIndices.push_back(i);
      valid = false;
    }
  }

  if (invalidIndices.size()) {
    return nonstd::make_unexpected(
        "Invalid indices found: " +
        value::print_array_snipped(invalidIndices,
                                   /* N to display */ 5));
  }

  return valid;
}